

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiNullHandleTests.cpp
# Opt level: O2

TestStatus * vkt::api::anon_unknown_1::reportStatus(TestStatus *__return_storage_ptr__,bool success)

{
  undefined7 in_register_00000031;
  allocator<char> local_29;
  string local_28;
  
  if ((int)CONCAT71(in_register_00000031,success) == 0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"Implementation allocated/freed the memory",&local_29);
    tcu::TestStatus::fail(__return_storage_ptr__,&local_28);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_28,"OK: no observable change",&local_29);
    tcu::TestStatus::pass(__return_storage_ptr__,&local_28);
  }
  std::__cxx11::string::~string((string *)&local_28);
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus reportStatus (const bool success)
{
	if (success)
		return tcu::TestStatus::pass("OK: no observable change");
	else
		return tcu::TestStatus::fail("Implementation allocated/freed the memory");
}